

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.h
# Opt level: O1

gameborder_t * __thiscall gameborder_t::operator=(gameborder_t *this,staticgameborder_t *other)

{
  this->offset = other->offset;
  this->size = other->size;
  FString::operator=(&this->tl,other->tl);
  FString::operator=(&this->t,other->t);
  FString::operator=(&this->tr,other->tr);
  FString::operator=(&this->l,other->l);
  FString::operator=(&this->r,other->r);
  FString::operator=(&this->bl,other->bl);
  FString::operator=(&this->b,other->b);
  FString::operator=(&this->br,other->br);
  return this;
}

Assistant:

gameborder_t &operator=(staticgameborder_t &other)
	{
		offset = other.offset;
		size = other.size;
		tl = other.tl;
		t = other.t;
		tr = other.tr;
		l = other.l;
		r = other.r;
		bl = other.bl;
		b = other.b;
		br = other.br;
		return *this;
	}